

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O0

size_t drmp3__on_read_memory(void *pUserData,void *pBufferOut,size_t bytesToRead)

{
  ulong uVar1;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t bytesRemaining;
  drmp3 *pMP3;
  undefined8 local_18;
  
  uVar1 = *(long *)(in_RDI + 0x52e0) - *(long *)(in_RDI + 0x52e8);
  local_18 = in_RDX;
  if (uVar1 < in_RDX) {
    local_18 = uVar1;
  }
  if (local_18 != 0) {
    memcpy(in_RSI,(void *)(*(long *)(in_RDI + 0x52d8) + *(long *)(in_RDI + 0x52e8)),local_18);
    *(ulong *)(in_RDI + 0x52e8) = local_18 + *(long *)(in_RDI + 0x52e8);
  }
  return local_18;
}

Assistant:

static size_t drmp3__on_read_memory(void* pUserData, void* pBufferOut, size_t bytesToRead)
{
    drmp3* pMP3 = (drmp3*)pUserData;
            drmp3_assert(pMP3 != NULL);
            drmp3_assert(pMP3->memory.dataSize >= pMP3->memory.currentReadPos);

    size_t bytesRemaining = pMP3->memory.dataSize - pMP3->memory.currentReadPos;
    if (bytesToRead > bytesRemaining) {
        bytesToRead = bytesRemaining;
    }

    if (bytesToRead > 0) {
        drmp3_copy_memory(pBufferOut, pMP3->memory.pData + pMP3->memory.currentReadPos, bytesToRead);
        pMP3->memory.currentReadPos += bytesToRead;
    }

    return bytesToRead;
}